

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

hittable_list * cornell_box_plus(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  hittable_list *in_RDI;
  shared_ptr<hittable> local_3e0;
  vec3 local_3d0;
  shared_ptr<hittable> local_3b8;
  undefined4 local_3a4;
  shared_ptr<hittable> local_3a0;
  vec3 local_390;
  vec3 local_378;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  shared_ptr<hittable> box2;
  vec3 local_330;
  shared_ptr<hittable> local_318;
  undefined4 local_304;
  shared_ptr<hittable> local_300;
  vec3 local_2f0;
  vec3 local_2d8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  shared_ptr<hittable> box1;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  shared_ptr<xy_rect> local_288;
  shared_ptr<hittable> local_278;
  shared_ptr<lambertian> local_264;
  int local_254;
  shared_ptr<xz_rect> local_250;
  shared_ptr<hittable> local_240;
  shared_ptr<lambertian> local_22c;
  int local_21c;
  shared_ptr<xz_rect> local_218;
  shared_ptr<hittable> local_208;
  shared_ptr<diffuse_light> local_1f4;
  int local_1e4;
  shared_ptr<xz_rect> local_1e0;
  shared_ptr<hittable> local_1d0;
  shared_ptr<diffuse_light> local_1bc;
  int local_1ac;
  shared_ptr<xz_rect> local_1a8;
  shared_ptr<flip_face> local_198;
  shared_ptr<hittable> local_188;
  shared_ptr<lambertian> local_174;
  int local_164;
  shared_ptr<yz_rect> local_160;
  shared_ptr<hittable> local_150;
  shared_ptr<lambertian> local_13c;
  int local_12c;
  shared_ptr<yz_rect> local_128;
  shared_ptr<hittable> local_118;
  vec3 local_108;
  undefined1 local_f0 [24];
  shared_ptr<diffuse_light> light;
  undefined1 local_b8 [24];
  shared_ptr<lambertian> green;
  undefined1 local_80 [24];
  shared_ptr<lambertian> white;
  vec3 local_50;
  undefined1 local_38 [24];
  shared_ptr<lambertian> red;
  hittable_list *objects;
  
  red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  hittable_list::hittable_list(in_RDI);
  vec3::vec3(&local_50,0.65,0.05,0.05);
  std::make_shared<constant_texture,vec3>((vec3 *)local_38);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_38 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_38);
  vec3::vec3((vec3 *)&green.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             0.73,0.73,0.73);
  std::make_shared<constant_texture,vec3>((vec3 *)local_80);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_80 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_80);
  vec3::vec3((vec3 *)&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,0.12,0.45,0.15);
  std::make_shared<constant_texture,vec3>((vec3 *)local_b8);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_b8 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_b8);
  vec3::vec3(&local_108,15.0,15.0,15.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_f0);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_f0 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_f0);
  local_12c = 0;
  local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22b;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_128,&local_12c,
             (int *)((long)&local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_13c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_13c);
  std::shared_ptr<hittable>::shared_ptr<yz_rect,void>(&local_118,&local_128);
  hittable_list::add(in_RDI,&local_118);
  std::shared_ptr<hittable>::~shared_ptr(&local_118);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_128);
  local_164 = 0;
  local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_160,&local_164,
             (int *)((long)&local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_174.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_174);
  std::shared_ptr<hittable>::shared_ptr<yz_rect,void>(&local_150,&local_160);
  hittable_list::add(in_RDI,&local_150);
  std::shared_ptr<hittable>::~shared_ptr(&local_150);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_160);
  local_1ac = 0xd5;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x157;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0xe3;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x14c;
  local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_1a8,&local_1ac,
             (int *)((long)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_1bc.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_1bc);
  std::make_shared<flip_face,std::shared_ptr<xz_rect>>((shared_ptr<xz_rect> *)&local_198);
  std::shared_ptr<hittable>::shared_ptr<flip_face,void>(&local_188,&local_198);
  hittable_list::add(in_RDI,&local_188);
  std::shared_ptr<hittable>::~shared_ptr(&local_188);
  std::shared_ptr<flip_face>::~shared_ptr(&local_198);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_1a8);
  local_1e4 = 0xd5;
  local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x157;
  local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0xe3;
  local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x14c;
  local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_1e0,&local_1e4,
             (int *)((long)&local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_1f4.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_1f4);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_1d0,&local_1e0);
  hittable_list::add(in_RDI,&local_1d0);
  std::shared_ptr<hittable>::~shared_ptr(&local_1d0);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_1e0);
  local_21c = 0;
  local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22b;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_218,&local_21c,
             (int *)((long)&local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_22c.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_22c);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_208,&local_218);
  hittable_list::add(in_RDI,&local_208);
  std::shared_ptr<hittable>::~shared_ptr(&local_208);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_218);
  local_254 = 0;
  local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x22b;
  local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x22b;
  local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_250,&local_254,
             (int *)((long)&local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
             (int *)((long)&local_264.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4),&local_264);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_240,&local_250);
  hittable_list::add(in_RDI,&local_240);
  std::shared_ptr<hittable>::~shared_ptr(&local_240);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_250);
  local_28c = 0;
  local_290 = 0x22b;
  local_294 = 0;
  local_298 = 0x22b;
  box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0x22b;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_288,&local_28c,&stack0xfffffffffffffd70,&stack0xfffffffffffffd6c,
             &stack0xfffffffffffffd68,
             (shared_ptr<lambertian> *)
             ((long)&box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 4));
  std::shared_ptr<hittable>::shared_ptr<xy_rect,void>(&local_278,&local_288);
  hittable_list::add(in_RDI,&local_278);
  std::shared_ptr<hittable>::~shared_ptr(&local_278);
  std::shared_ptr<xy_rect>::~shared_ptr(&local_288);
  vec3::vec3(&local_2d8,0.0,0.0,0.0);
  vec3::vec3(&local_2f0,165.0,330.0,165.0);
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_2c0,&local_2d8,(shared_ptr<lambertian> *)&local_2f0);
  std::shared_ptr<hittable>::shared_ptr<box,void>
            ((shared_ptr<hittable> *)local_2b0,(shared_ptr<box> *)local_2c0);
  std::shared_ptr<box>::~shared_ptr((shared_ptr<box> *)local_2c0);
  local_304 = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_300,(int *)local_2b0);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_2b0,(shared_ptr<rotate_y> *)&local_300);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_300);
  vec3::vec3(&local_330,265.0,0.0,295.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_318,(vec3 *)local_2b0);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_2b0,(shared_ptr<translate> *)&local_318);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_318);
  this = &box2.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<hittable>::shared_ptr
            ((shared_ptr<hittable> *)this,(shared_ptr<hittable> *)local_2b0);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)this);
  std::shared_ptr<hittable>::~shared_ptr
            ((shared_ptr<hittable> *)
             &box2.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_378,0.0,0.0,0.0);
  vec3::vec3(&local_390,165.0,165.0,165.0);
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_360,&local_378,(shared_ptr<lambertian> *)&local_390);
  std::shared_ptr<hittable>::shared_ptr<box,void>
            ((shared_ptr<hittable> *)local_350,(shared_ptr<box> *)local_360);
  std::shared_ptr<box>::~shared_ptr((shared_ptr<box> *)local_360);
  local_3a4 = 0xffffffee;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_3a0,(int *)local_350);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_350,(shared_ptr<rotate_y> *)&local_3a0);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_3a0);
  vec3::vec3(&local_3d0,130.0,0.0,65.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_3b8,(vec3 *)local_350);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_350,(shared_ptr<translate> *)&local_3b8);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_3b8);
  std::shared_ptr<hittable>::shared_ptr(&local_3e0,(shared_ptr<hittable> *)local_350);
  hittable_list::add(in_RDI,&local_3e0);
  std::shared_ptr<hittable>::~shared_ptr(&local_3e0);
  red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_350);
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_2b0);
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)(local_f0 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_b8 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_80 + 0x10));
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_38 + 0x10));
  if ((red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    hittable_list::~hittable_list(in_RDI);
  }
  return in_RDI;
}

Assistant:

hittable_list cornell_box_plus() {
    hittable_list objects;

    auto red = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.65, 0.05, 0.05)));
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    auto green = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.12, 0.45, 0.15)));
    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(15, 15, 15)));

    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 555, green));
    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 0, red));
    objects.add(make_shared<flip_face>(make_shared<xz_rect>(213, 343, 227, 332, 554, light)));
    objects.add(make_shared<xz_rect>(213, 343, 227, 332, 554, light));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 555, white));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 0, white));
    objects.add(make_shared<xy_rect>(0, 555, 0, 555, 555, white));

    shared_ptr<hittable> box1 = make_shared<box>(vec3(0,0,0), vec3(165,330,165), white);
    box1 = make_shared<rotate_y>(box1, 15);
    box1 = make_shared<translate>(box1, vec3(265,0,295));
    objects.add(box1);

    shared_ptr<hittable> box2 = make_shared<box>(vec3(0,0,0), vec3(165,165,165), white);
    box2 = make_shared<rotate_y>(box2, -18);
    box2 = make_shared<translate>(box2, vec3(130,0,65));
    objects.add(box2);

    return objects;
}